

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,Version *version)

{
  ostream *poVar1;
  ulong uVar2;
  Version *version_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,version->majorVersion);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,version->minorVersion);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,version->patchNumber);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<(os,"-");
    poVar1 = std::operator<<(poVar1,(string *)&version->branchName);
    poVar1 = std::operator<<(poVar1,".");
    std::ostream::operator<<(poVar1,version->buildNumber);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, Version const& version ) {
        os  << version.majorVersion << "."
            << version.minorVersion << "."
            << version.patchNumber;

        if( !version.branchName.empty() ) {
            os  << "-" << version.branchName
                << "." << version.buildNumber;
        }
        return os;
    }